

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void EDCircles::sortArc(MyArc *arcs,int noArcs)

{
  ulong uVar1;
  double *pdVar2;
  int j;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  MyArc t;
  
  iVar5 = 1;
  if (1 < noArcs) {
    iVar5 = noArcs;
  }
  pdVar6 = &arcs[1].coverRatio;
  uVar7 = 1;
  for (uVar8 = 0; uVar8 != iVar5 - 1; uVar8 = uVar8 + 1) {
    uVar4 = uVar8 & 0xffffffff;
    pdVar2 = pdVar6;
    for (uVar3 = uVar7; (uint)noArcs != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = uVar3 & 0xffffffff;
      if (*pdVar2 < arcs[(int)uVar4].coverRatio || *pdVar2 == arcs[(int)uVar4].coverRatio) {
        uVar1 = uVar4;
      }
      uVar4 = uVar1;
      pdVar2 = pdVar2 + 0x15;
    }
    if (uVar8 != uVar4) {
      memcpy(&t,arcs + uVar8,0xa8);
      memcpy(arcs + uVar8,arcs + (int)uVar4,0xa8);
      memcpy(arcs + (int)uVar4,&t,0xa8);
    }
    uVar7 = uVar7 + 1;
    pdVar6 = pdVar6 + 0x15;
  }
  return;
}

Assistant:

void EDCircles::sortArc(MyArc * arcs, int noArcs)
{
	for (int i = 0; i<noArcs - 1; i++) {
		int max = i;
		for (int j = i + 1; j<noArcs; j++) {
			if (arcs[j].coverRatio > arcs[max].coverRatio) max = j;
		} //end-for

		if (max != i) {
			MyArc t = arcs[i];
			arcs[i] = arcs[max];
			arcs[max] = t;
		} // end-if
	} //end-for
}